

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawner.cpp
# Opt level: O0

void __thiscall spawner::Spawner::decodeParam(Spawner *this,tag pTag)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  string local_88 [55];
  allocator local_51;
  string local_50 [8];
  string logSeg;
  size_t sglen;
  char *ntok;
  uint8_t pData;
  Spawner *this_local;
  tag pTag_local;
  
  pcVar2 = findNextToken('%',';',&this->tokenFormat,this->mLogPoint);
  uVar5 = (long)pcVar2 - (long)this->mLogPoint;
  pcVar1 = this->mLogPoint;
  logSeg.field_2._8_8_ = uVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,uVar5,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::operator<<((ostream *)&this->field_0x100300,local_50);
  if (*pcVar2 != '\0') {
    lVar3 = std::__cxx11::string::size();
    this->mLogPoint = pcVar2 + lVar3 + 1;
  }
  if (pTag.data == 0xa1) {
    this->mState = ParamU8;
  }
  else if (pTag.data == 0xa2) {
    this->mState = Param8;
  }
  else if (pTag.data == 0xa3) {
    this->mState = ParamU16;
  }
  else if (pTag.data == 0xa4) {
    this->mState = Param16;
  }
  else if (pTag.data == 0xa5) {
    this->mState = ParamU32;
  }
  else if (pTag.data == 0xa6) {
    this->mState = Param32;
  }
  else if (pTag.data == 0xa7) {
    this->mState = ParamU32or34;
  }
  else if (pTag.data == 0xa8) {
    this->mState = Param32or34;
  }
  else if (pTag.data == 0xa9) {
    this->mState = ParamU64;
  }
  else if (pTag.data == 0xaa) {
    this->mState = Param64;
  }
  else if (pTag.data == 0xab) {
    this->mState = ParamFloat;
  }
  else if (pTag.data == 0xac) {
    this->mState = ParamDouble;
  }
  else if (pTag.data == 0xad) {
    this->mState = ParamVoidP;
  }
  else if (pTag.data == 0xae) {
    this->mState = ParamBufferLogSz;
  }
  else if (pTag.data == 0xaf) {
    this->mState = ParamStrSz;
  }
  else {
    std::__cxx11::stringstream::str();
    poVar4 = std::operator<<((ostream *)&std::cout,local_88);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_88);
    std::__cxx11::stringstream::~stringstream((stringstream *)&this->mSs);
    std::__cxx11::stringstream::stringstream((stringstream *)&this->mSs);
    this->mState = Logpoint;
  }
  this->mReadSz = 0;
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void decodeParam(tag pTag)
    {
        auto pData = pTag.data;
        auto ntok = findNextToken('%', ';', tokenFormat, mLogPoint);
        size_t sglen = uintptr_t(ntok)-uintptr_t(mLogPoint);
        std::string logSeg(mLogPoint, sglen);

        // std::cout << "state: Tag: " << std::hex << std::setw(2) << std::setfill('0') << unsigned(pData) << "\n";
        // std::cout << "seg str:" << logSeg  << "\n";

        mSs << logSeg;
        if (*ntok) mLogPoint = ntok + tokenFormat.size() + 1;
        if      (pData == TypeTraits<unsigned char>::type_id)      mState = State::ParamU8;
        else if (pData == TypeTraits<signed char>::type_id)        mState = State::Param8;
        else if (pData == TypeTraits<unsigned short>::type_id)     mState = State::ParamU16;
        else if (pData == TypeTraits<short>::type_id)              mState = State::Param16;
        else if (pData == TypeTraits<unsigned int>::type_id)       mState = State::ParamU32;
        else if (pData == TypeTraits<int>::type_id)                mState = State::Param32;
        else if (pData == TypeTraits<unsigned long>::type_id)      mState = State::ParamU32or34;
        else if (pData == TypeTraits<long>::type_id)               mState = State::Param32or34;
        else if (pData == TypeTraits<unsigned long long>::type_id) mState = State::ParamU64;
        else if (pData == TypeTraits<long long>::type_id)          mState = State::Param64;
        else if (pData == TypeTraits<float>::type_id)              mState = State::ParamFloat;
        else if (pData == TypeTraits<double>::type_id)             mState = State::ParamDouble;
        else if (pData == TypeTraits<void*>::type_id)              mState = State::ParamVoidP;
        else if (pData == TypeTraits<BufferLog>::type_id)          mState = State::ParamBufferLogSz;
        else if (pData == TypeTraits<const char*>::type_id)        mState = State::ParamStrSz;
        else
        {
            std::cout << mSs.str() << "\n";
            // RTP TODO: Buggy in ARM gcc
            // mSs = std::stringstream();
            mSs.~basic_stringstream();
            new (&mSs) std::stringstream();
            // mSs.str("");
            mState = State::Logpoint;
        }
        mReadSz = 0;
    }